

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

pair<int,_int> __thiscall QTreeViewPrivate::startAndEndColumns(QTreeViewPrivate *this,QRect *rect)

{
  QWidget *this_00;
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  pair<int,_int> pVar5;
  
  this_00 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  iVar3 = QHeaderView::visualIndexAt(this->header,(rect->x1).m_i);
  iVar4 = QHeaderView::visualIndexAt(this->header,(rect->x2).m_i);
  bVar2 = QWidget::isRightToLeft(this_00);
  if (bVar2) {
    if (iVar3 == -1) {
      iVar3 = QHeaderView::count(this->header);
      iVar3 = iVar3 + -1;
    }
    if (iVar4 == -1) {
      iVar4 = 0;
    }
  }
  else {
    iVar1 = 0;
    if (iVar3 != -1) {
      iVar1 = iVar3;
    }
    iVar3 = iVar1;
    if (iVar4 == -1) {
      iVar4 = QHeaderView::count(this->header);
      iVar4 = iVar4 + -1;
    }
  }
  iVar1 = iVar4;
  if (iVar3 < iVar4) {
    iVar1 = iVar3;
  }
  if (iVar4 < iVar3) {
    iVar4 = iVar3;
  }
  pVar5.second = iVar4;
  pVar5.first = iVar1;
  return pVar5;
}

Assistant:

std::pair<int,int> QTreeViewPrivate::startAndEndColumns(const QRect &rect) const
{
    Q_Q(const QTreeView);
    int start = header->visualIndexAt(rect.left());
    int end = header->visualIndexAt(rect.right());
    if (q->isRightToLeft()) {
        start = (start == -1 ? header->count() - 1 : start);
        end = (end == -1 ? 0 : end);
    } else {
        start = (start == -1 ? 0 : start);
        end = (end == -1 ? header->count() - 1 : end);
    }
    return std::pair(qMin(start, end), qMax(start, end));
}